

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::SetType(cmTarget *this,TargetType type,string *name)

{
  std::__cxx11::string::_M_assign((string *)&this->Name);
  this->TargetTypeValue = type;
  this->RecordDependencies = type - STATIC_LIBRARY < 3;
  return;
}

Assistant:

void cmTarget::SetType(TargetType type, const std::string& name)
{
  this->Name = name;
  // only add dependency information for library targets
  this->TargetTypeValue = type;
  if(this->TargetTypeValue >= STATIC_LIBRARY
     && this->TargetTypeValue <= MODULE_LIBRARY)
    {
    this->RecordDependencies = true;
    }
  else
    {
    this->RecordDependencies = false;
    }
}